

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O0

void * __thiscall
QOffscreenPlatformNativeInterface::nativeResourceForIntegration
          (QOffscreenPlatformNativeInterface *this,QByteArray *resource)

{
  long lVar1;
  bool bVar2;
  char **in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffe0;
  code *pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator==(in_stack_ffffffffffffffe0,in_RDI);
  if (bVar2) {
    pcVar3 = setConfiguration;
  }
  else {
    bVar2 = operator==(in_stack_ffffffffffffffe0,in_RDI);
    if (bVar2) {
      pcVar3 = configuration;
    }
    else {
      pcVar3 = (code *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

void *QOffscreenPlatformNativeInterface::nativeResourceForIntegration(const QByteArray &resource)
{
    if (resource == "setConfiguration")
        return reinterpret_cast<void*>(&QOffscreenPlatformNativeInterface::setConfiguration);
    else if (resource == "configuration")
        return reinterpret_cast<void*>(&QOffscreenPlatformNativeInterface::configuration);
    else
        return nullptr;
}